

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O2

base_uint<256U> * __thiscall
base_uint<256U>::operator-(base_uint<256U> *__return_storage_ptr__,base_uint<256U> *this)

{
  long lVar1;
  int i;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    __return_storage_ptr__->pn[lVar2] = ~this->pn[lVar2];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator++(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

base_uint operator-() const
    {
        base_uint ret;
        for (int i = 0; i < WIDTH; i++)
            ret.pn[i] = ~pn[i];
        ++ret;
        return ret;
    }